

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O1

void __thiscall
ymfm::ssg_resampler<ymfm::ymfm_output<4>,_1,_false>::resample_4_3
          (ssg_resampler<ymfm::ymfm_output<4>,_1,_false> *this,ymfm_output<4> *output,
          uint32_t numsamples)

{
  uint uVar1;
  int32_t *piVar2;
  int32_t sum2;
  int32_t sum1;
  int32_t sum0;
  int local_3c;
  int local_38;
  int local_34;
  
  if (numsamples != 0) {
    piVar2 = output->data + 3;
    do {
      uVar1 = this->m_sampindex & 3;
      local_34 = (this->m_last).data[0] * uVar1;
      local_38 = (this->m_last).data[1] * uVar1;
      local_3c = (this->m_last).data[2] * uVar1;
      if (uVar1 != 3) {
        clock_and_add(this,&local_34,&local_38,&local_3c,uVar1 ^ 3);
      }
      piVar2[-2] = local_34 / 3;
      piVar2[-1] = local_38 / 3;
      *piVar2 = local_3c / 3;
      this->m_sampindex = this->m_sampindex + 1;
      piVar2 = piVar2 + 4;
      numsamples = numsamples - 1;
    } while (numsamples != 0);
  }
  return;
}

Assistant:

void ssg_resampler<OutputType, FirstOutput, MixTo1>::resample_4_3(OutputType *output, uint32_t numsamples)
{
	for (uint32_t samp = 0; samp < numsamples; samp++, output++)
	{
		int32_t sum0 = 0, sum1 = 0, sum2 = 0;
		int32_t step = bitfield(m_sampindex, 0, 2);
		add_last(sum0, sum1, sum2, step);
		if (step != 3)
			clock_and_add(sum0, sum1, sum2, 3 - step);
		write_to_output(output, sum0, sum1, sum2, 3);
	}
}